

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

double __thiscall timer::get_elapsed_secs(timer *this)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  timer_ticks stop_time;
  timer_ticks local_18;
  
  dVar2 = 0.0;
  if ((this->field_0x10 & 1) != 0) {
    local_18 = this->m_stop_time;
    if ((this->field_0x10 & 2) == 0) {
      query_counter(&local_18);
    }
    lVar1 = local_18 - this->m_start_time;
    auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * g_inv_freq;
  }
  return dVar2;
}

Assistant:

double timer::get_elapsed_secs() const
{
   assert(m_started);
   if (!m_started)
      return 0;

   timer_ticks stop_time = m_stop_time;
   if (!m_stopped)
      query_counter(&stop_time);

   timer_ticks delta = stop_time - m_start_time;
   return delta * g_inv_freq;
}